

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O0

void __thiscall egc::Sequencer::BZMF(Sequencer *this,unsigned_short instruction)

{
  unsigned_short word;
  ostream *poVar1;
  element_type *peVar2;
  unsigned_short a;
  unsigned_short k;
  unsigned_short instruction_local;
  Sequencer *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"BZMF");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::oct);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,instruction & 0xfff);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  word = Memory::Read(peVar2,0,0);
  if ((word == 0) || ((word & 0x4000) != 0)) {
    peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    Memory::Write(peVar2,5,instruction & 0xfff);
  }
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,0,word);
  return;
}

Assistant:

void egc::Sequencer::BZMF (unsigned short instruction)
{
    unsigned short k = instruction & 007777u;

    std::cout << "BZMF" << " " << std::oct << k << std::dec << std::endl;

    auto a = m_Memory->Read(000000u);

    if (a == 000000u || a & 040000u)
    {
        m_Memory->Write(00005u, k);
    }

    m_Memory->Write(00000u, a);
}